

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

void __thiscall Clasp::SatPreprocessor::discardClauses(SatPreprocessor *this,bool full)

{
  ClauseList *pCVar1;
  pointer ppCVar2;
  Clause *pCVar3;
  size_type sVar4;
  Clause *pCVar5;
  uint uVar6;
  ulong uVar7;
  
  pCVar1 = &this->clauses_;
  sVar4 = (this->clauses_).ebo_.size;
  if (sVar4 != 0) {
    uVar7 = 0;
    do {
      pCVar5 = (pCVar1->ebo_).buf[uVar7];
      if (pCVar5 != (Clause *)0x0) {
        operator_delete(pCVar5);
        sVar4 = (this->clauses_).ebo_.size;
      }
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != sVar4);
  }
  ppCVar2 = (pCVar1->ebo_).buf;
  (pCVar1->ebo_).buf = (pointer)0x0;
  (this->clauses_).ebo_.size = 0;
  (this->clauses_).ebo_.cap = 0;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2);
  }
  pCVar5 = this->elimTop_;
  if (this->elimTop_ != (Clause *)0x0 && full) {
    do {
      pCVar3 = (pCVar5->data_).next;
      operator_delete(pCVar5);
      pCVar5 = pCVar3;
    } while (pCVar3 != (Clause *)0x0);
    this->elimTop_ = (Clause *)0x0;
  }
  if (full) {
    (this->seen_).lo = 1;
    (this->seen_).hi = 1;
  }
  return;
}

Assistant:

void SatPreprocessor::discardClauses(bool full) {
	for (ClauseList::size_type i = 0; i != clauses_.size(); ++i) {
		if (clauses_[i]) { clauses_[i]->destroy(); }
	}
	ClauseList().swap(clauses_);
	if (Clause* r = (full ? elimTop_ : 0)) {
		do {
			Clause* t = r;
			 r = r->next();
			 t->destroy();
		} while (r);
		elimTop_ = 0;
	}
	if (full) { seen_ = Range32(1,1); }
}